

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_tester.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::CommandLineInterfaceTester::ExpectFileContent
          (CommandLineInterfaceTester *this,string_view filename,string_view content)

{
  bool bVar1;
  LogMessage *pLVar2;
  char *pcVar3;
  AlphaNum *c;
  size_type in_R9;
  string_view s;
  FixedMapping replacements;
  Status *local_210;
  AssertHelper local_1d8;
  Message local_1d0;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_1c8;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  *local_1a8;
  undefined8 local_1a0;
  lts_20250127 *local_198;
  AlphaNum *pAStack_190;
  string local_188;
  undefined1 local_168 [8];
  AssertionResult gtest_ar;
  Voidify local_141;
  undefined1 local_140 [32];
  pair<const_absl::lts_20250127::Status_*,_const_char_*> absl_log_internal_check_ok_goo;
  string file_contents;
  AlphaNum local_e0;
  AlphaNum local_b0;
  AlphaNum local_80;
  undefined1 local_50 [8];
  string path;
  CommandLineInterfaceTester *this_local;
  string_view content_local;
  string_view filename_local;
  
  c = (AlphaNum *)content._M_str;
  path.field_2._8_8_ = this;
  absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>(&local_80,&this->temp_directory_);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_b0,"/");
  absl::lts_20250127::AlphaNum::AlphaNum(&local_e0,filename);
  absl::lts_20250127::StrCat_abi_cxx11_
            ((string *)local_50,(lts_20250127 *)&local_80,&local_b0,&local_e0,c);
  std::__cxx11::string::string((string *)&absl_log_internal_check_ok_goo.second);
  std::pair<const_absl::lts_20250127::Status_*,_const_char_*>::
  pair<const_absl::lts_20250127::Status_*,_const_char_*,_true>
            ((pair<const_absl::lts_20250127::Status_*,_const_char_*> *)(local_140 + 0x18));
  File::GetContents((string *)local_140,(string *)local_50,
                    (bool)((char)&absl_log_internal_check_ok_goo + '\b'));
  local_140._24_8_ = absl::lts_20250127::log_internal::AsStatus((Status *)local_140);
  bVar1 = absl::lts_20250127::Status::ok((Status *)local_140._24_8_);
  if (bVar1) {
    local_210 = (Status *)0x0;
  }
  else {
    local_210 = (Status *)
                absl::lts_20250127::status_internal::MakeCheckFailString
                          ((Nonnull<const_absl::Status_*>)local_140._24_8_,
                           "File::GetContents(path, &file_contents, true) is OK");
  }
  absl_log_internal_check_ok_goo.first = local_210;
  bVar1 = absl::lts_20250127::Status::ok((Status *)local_140._24_8_);
  absl::lts_20250127::Status::~Status((Status *)local_140);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    pcVar3 = absl::lts_20250127::implicit_cast<char_const*>
                       ((type_identity_t<const_char_*>)absl_log_internal_check_ok_goo.first);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&gtest_ar.message_,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface_tester.cc"
               ,0xb5,pcVar3);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream
                       ((LogMessage *)&gtest_ar.message_);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_141,pLVar2);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&gtest_ar.message_);
  }
  local_198 = (lts_20250127 *)content._M_len;
  pAStack_190 = (AlphaNum *)content._M_str;
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  ::
  pair<const_char_(&)[8],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
            (&local_1c8,(char (*) [8])"$tmpdir",&this->temp_directory_);
  local_1a8 = &local_1c8;
  local_1a0 = 1;
  s._M_str = (char *)local_1a8;
  s._M_len = (size_t)pAStack_190;
  replacements._M_len = in_R9;
  replacements._M_array = (iterator)0x1;
  absl::lts_20250127::StrReplaceAll_abi_cxx11_(&local_188,local_198,s,replacements);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_168,"absl::StrReplaceAll(content, {{\"$tmpdir\", temp_directory_}})",
             "file_contents",&local_188,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &absl_log_internal_check_ok_goo.second);
  std::__cxx11::string::~string((string *)&local_188);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_168);
  if (!bVar1) {
    testing::Message::Message(&local_1d0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_168);
    testing::internal::AssertHelper::AssertHelper
              (&local_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface_tester.cc"
               ,0xb8,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1d8,&local_1d0);
    testing::internal::AssertHelper::~AssertHelper(&local_1d8);
    testing::Message::~Message(&local_1d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_168);
  std::__cxx11::string::~string((string *)&absl_log_internal_check_ok_goo.second);
  std::__cxx11::string::~string((string *)local_50);
  return;
}

Assistant:

void CommandLineInterfaceTester::ExpectFileContent(absl::string_view filename,
                                                   absl::string_view content) {
  std::string path = absl::StrCat(temp_directory_, "/", filename);
  std::string file_contents;
  ABSL_CHECK_OK(File::GetContents(path, &file_contents, true));

  EXPECT_EQ(absl::StrReplaceAll(content, {{"$tmpdir", temp_directory_}}),
            file_contents);
}